

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

ostream * argagg::operator<<(ostream *os,parser *x)

{
  bool bVar1;
  reference pdVar2;
  reference __lhs;
  const_reference __rhs;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  definition *definition;
  const_iterator __end1;
  const_iterator __begin1;
  vector<argagg::definition,_std::allocator<argagg::definition>_> *__range1;
  parser *x_local;
  ostream *os_local;
  
  __end1 = std::vector<argagg::definition,_std::allocator<argagg::definition>_>::begin
                     (&x->definitions);
  definition = (definition *)
               std::vector<argagg::definition,_std::allocator<argagg::definition>_>::end
                         (&x->definitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
                                     *)&definition), bVar1) {
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
             ::operator*(&__end1);
    std::operator<<(os,"    ");
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pdVar2->flags);
    flag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pdVar2->flags);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&flag), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
      std::operator<<(os,(string *)__lhs);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back(&pdVar2->flags);
      bVar1 = std::operator!=(__lhs,__rhs);
      if (bVar1) {
        std::operator<<(os,", ");
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    poVar3 = std::operator<<(os,"\n        ");
    poVar3 = std::operator<<(poVar3,(string *)&pdVar2->help);
    std::operator<<(poVar3,'\n');
    __gnu_cxx::
    __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
    ::operator++(&__end1);
  }
  return os;
}

Assistant:

inline
std::ostream& operator << (std::ostream& os, const argagg::parser& x)
{
  for (auto& definition : x.definitions) {
    os << "    ";
    for (auto& flag : definition.flags) {
      os << flag;
      if (flag != definition.flags.back()) {
        os << ", ";
      }
    }
    os << "\n        " << definition.help << '\n';
  }
  return os;
}